

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

_Bool fy_document_is_colorized(fy_document *fyd)

{
  fy_parse_cfg_flags fVar1;
  int iVar2;
  
  if ((fyd != (fy_document *)0x0) &&
     (fVar1 = (fyd->parse_cfg).flags, (fVar1 & FYPCF_COLLECT_DIAG) == FYPCF_COLOR_AUTO)) {
    fVar1 = fVar1 & (FYPCF_COLOR_FORCE|FYPCF_COLOR_NONE);
    if (fVar1 != FYPCF_COLOR_AUTO) {
      return fVar1 == FYPCF_COLOR_FORCE;
    }
    iVar2 = fileno(_stderr);
    iVar2 = isatty(iVar2);
    return iVar2 == 1;
  }
  return false;
}

Assistant:

bool fy_document_is_colorized(struct fy_document *fyd) {
    unsigned int color_flags;

    if (!fyd)
        return false;

    if (fyd->parse_cfg.flags & FYPCF_COLLECT_DIAG)
        return false;

    color_flags = fyd->parse_cfg.flags & FYPCF_COLOR(FYPCF_COLOR_MASK);
    if (color_flags == FYPCF_COLOR_AUTO)
        return isatty(fileno(fy_document_get_error_fp(fyd))) == 1;

    return color_flags == FYPCF_COLOR_FORCE;
}